

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QWidget * __thiscall QMainWindowLayout::getSeparatorWidget(QMainWindowLayout *this)

{
  QLatin1StringView str;
  WidgetAttribute attribute;
  bool bVar1;
  QWidget *parent;
  QWidget *size;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QWidget *result;
  QList<QWidget_*> *in_stack_ffffffffffffff90;
  value_type in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  QFlagsStorage<Qt::WindowType> f;
  undefined1 local_14 [7];
  QWidget *this_00;
  
  this_00 = *(QWidget **)(in_FS_OFFSET + 0x28);
  uVar2 = (undefined4)in_RDI;
  f.i = (Int)((ulong)in_RDI >> 0x20);
  stack0xfffffffffffffff0 = (value_type)0x0;
  bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x5f842a);
  if (bVar1) {
    parent = (QWidget *)operator_new(0x28);
    size = QLayout::parentWidget((QLayout *)in_stack_ffffffffffffffa0);
    memset(local_14,0,4);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x5f8482);
    QWidget::QWidget(in_stack_ffffffffffffffa0,parent,(WindowFlags)f.i);
    attribute = (WidgetAttribute)((ulong)parent >> 0x20);
    bVar1 = SUB81((ulong)parent >> 0x18,0);
    unique0x10000220 = parent;
    QWidget::setAttribute(this_00,attribute,bVar1);
    QWidget::setAutoFillBackground(in_stack_ffffffffffffffa0,SUB81((ulong)parent >> 0x38,0));
    in_stack_ffffffffffffffa0 = stack0xfffffffffffffff0;
    Qt::Literals::StringLiterals::operator____L1((char *)parent,(size_t)size);
    str.m_data._0_4_ = uVar2;
    str.m_size = (qsizetype)in_stack_ffffffffffffffa0;
    str.m_data._4_4_ = f.i;
    QAnyStringView::QAnyStringView((QAnyStringView *)parent,str);
    QObject::setObjectName((QAnyStringView *)in_stack_ffffffffffffffa0);
  }
  else {
    register0x00000000 = QList<QWidget_*>::takeLast(in_stack_ffffffffffffff90);
  }
  QSet<QWidget_*>::insert
            ((QSet<QWidget_*> *)CONCAT44(f.i,uVar2),(QWidget **)in_stack_ffffffffffffffa0);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_00) {
    return stack0xfffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QMainWindowLayout::getSeparatorWidget()
{
    QWidget *result = nullptr;
    if (!unusedSeparatorWidgets.isEmpty()) {
        result = unusedSeparatorWidgets.takeLast();
    } else {
        result = new QWidget(parentWidget());
        result->setAttribute(Qt::WA_MouseNoMask, true);
        result->setAutoFillBackground(false);
        result->setObjectName("qt_qmainwindow_extended_splitter"_L1);
    }
    usedSeparatorWidgets.insert(result);
    return result;
}